

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::ApprovalTestNamer::getDirectory_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  string sub_directory;
  string local_30;
  
  getTestSourceDirectory_abi_cxx11_(__return_storage_ptr__,this);
  getApprovalsSubdirectory_abi_cxx11_(&local_30,this);
  ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_30._M_dataplus._M_p)
  ;
  SystemUtils::ensureDirectoryExists(__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getDirectory() const
    {
        std::string directory = getTestSourceDirectory();
        std::string sub_directory = getApprovalsSubdirectory();
        directory += sub_directory;
        SystemUtils::ensureDirectoryExists(directory);
        return directory;
    }